

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall MemoryManager::addPage(MemoryManager *this,uint32_t addr)

{
  uint16_t k;
  uint8_t **ppuVar1;
  long lVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar6 = addr >> 0x16;
  ppuVar1 = this->memory[uVar6];
  uVar4 = addr >> 0xc & 0x3ff;
  if (ppuVar1 == (uint8_t **)0x0) {
    ppuVar1 = (uint8_t **)operator_new__(0x2000);
    this->memory[uVar6] = ppuVar1;
    for (lVar2 = 0; ppuVar1 = this->memory[uVar6], lVar2 != 0x400; lVar2 = lVar2 + 1) {
      ppuVar1[lVar2] = (uint8_t *)0x0;
    }
  }
  if (ppuVar1[uVar4] != (uint8_t *)0x0) {
    return;
  }
  pvVar3 = operator_new__(0x1000);
  uVar5 = (ulong)(uVar4 << 3);
  *(void **)((long)ppuVar1 + uVar5) = pvVar3;
  memset(*(void **)((long)this->memory[uVar6] + uVar5),0,0x1000);
  return;
}

Assistant:

void MemoryManager::addPage(uint32_t addr){
    uint16_t i = this->getFirstIndex(addr);
    uint16_t j = this->getSecondIndex(addr);
    if(!this->memory[i]){
        this->memory[i] = new uint8_t* [1024];
        for(uint16_t k = 0; k < 1024; k++)
            this->memory[i][k] = nullptr;
    }
    if(!this->memory[i][j]){
        this->memory[i][j] = new uint8_t[4096];
        memset(this->memory[i][j], 0 , 4096);
//        for(uint16_t k = 0; k < 4096; k++)
//            this->memory[i][j][k] = 0;
    }
}